

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster<Eigen::Matrix<double,_1,_1,_1,_1,_1>,_void>::load
          (type_caster<Eigen::Matrix<double,_1,_1,_1,_1,_1>,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  handle hVar3;
  npy_api *pnVar4;
  undefined7 in_register_00000011;
  ActualDstType actualDst;
  plain_array<double,_1,_1,_0> *this_00;
  array ref;
  array buf;
  EigenConformable<true> fits;
  plain_array<double,_1,_1,_0> local_68;
  array local_60;
  array local_58;
  EigenConformable<true> local_50;
  
  this_00 = &local_68;
  if (((int)CONCAT71(in_register_00000011,convert) == 0) &&
     (bVar1 = array_t<double,_16>::check_(src), !bVar1)) {
    return false;
  }
  bVar1 = false;
  array::ensure(&local_58,src,0);
  if (local_58.super_buffer.super_object.super_handle.m_ptr == (object)0x0) goto LAB_001f802e;
  iVar2 = *(int *)((long)local_58.super_buffer.super_object.super_handle.m_ptr + 0x18);
  if (((long)iVar2 - 3U < 0xfffffffffffffffe) ||
     (EigenProps<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>::conformable(&local_50,&local_58),
     local_50.conformable == false)) {
    bVar1 = false;
    goto LAB_001f802e;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_> *)&local_68,local_50.rows,
             local_50.cols);
  (this->value).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.m_data.array
  [0] = (double)local_68.array[0];
  local_60.super_buffer.super_object.super_handle.m_ptr = (buffer)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar3 = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>>
                    (&this->value,(PyObject *)&_Py_NoneStruct);
  local_68.array[0] = (double  [1])(double  [1])hVar3;
  pybind11::object::~object((object *)&local_60);
  if (iVar2 == 1) {
    array::squeeze(&local_60);
LAB_001f7ff3:
    pybind11::object::operator=((object *)this_00,(object *)&local_60);
    pybind11::object::~object((object *)&local_60);
  }
  else if (*(int *)&hVar3.m_ptr[1].ob_type == 1) {
    array::squeeze(&local_60);
    this_00 = (plain_array<double,_1,_1,_0> *)&local_58;
    goto LAB_001f7ff3;
  }
  pnVar4 = npy_api::get();
  iVar2 = (*pnVar4->PyArray_CopyInto_)
                    ((PyObject *)local_68.array[0],
                     (PyObject *)local_58.super_buffer.super_object.super_handle.m_ptr);
  bVar1 = -1 < iVar2;
  if (!bVar1) {
    PyErr_Clear();
  }
  pybind11::object::~object((object *)&local_68);
LAB_001f802e:
  pybind11::object::~object((object *)&local_58);
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        // If we're in no-convert mode, only load if given an array of the correct type
        if (!convert && !isinstance<array_t<Scalar>>(src))
            return false;

        // Coerce into an array, but don't do type conversion yet; the copy below handles it.
        auto buf = array::ensure(src);

        if (!buf)
            return false;

        auto dims = buf.ndim();
        if (dims < 1 || dims > 2)
            return false;

        auto fits = props::conformable(buf);
        if (!fits)
            return false;

        // Allocate the new type, then build a numpy reference into it
        value = Type(fits.rows, fits.cols);
        auto ref = reinterpret_steal<array>(eigen_ref_array<props>(value));
        if (dims == 1) ref = ref.squeeze();
        else if (ref.ndim() == 1) buf = buf.squeeze();

        int result = detail::npy_api::get().PyArray_CopyInto_(ref.ptr(), buf.ptr());

        if (result < 0) { // Copy failed!
            PyErr_Clear();
            return false;
        }

        return true;
    }